

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoDebugger.cpp
# Opt level: O2

bool __thiscall NanoDebugger::disassembleInstruction(NanoDebugger *this,string *instruction)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Instruction ins;
  string opcode;
  Instruction local_130;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = NanoVM::fetch(&this->super_NanoVM,&local_130);
  if (!bVar1) {
    return bVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,instructionStr[local_130.opcode],(allocator<char> *)&local_d8);
  if (local_130.opcode < 0x1e) {
    if ((0x3bb7c000U >> (local_130.opcode & 0x1f) & 1) == 0) {
      if ((0x4400000U >> (local_130.opcode & 0x1f) & 1) != 0) {
        std::__cxx11::string::_M_assign((string *)instruction);
        goto LAB_0010266e;
      }
      goto LAB_001026a6;
    }
    if (local_130.srcType == '\0') {
      pcVar2 = " reg";
      if (local_130.isSrcMem != false) {
        pcVar2 = " @reg";
      }
      std::operator+(&local_f8,&local_38,pcVar2);
      std::__cxx11::to_string(&local_118,(uint)local_130.srcReg);
      std::operator+(&local_d8,&local_f8,&local_118);
    }
    else {
      pcVar2 = " ";
      if (local_130.isSrcMem != false) {
        pcVar2 = " @";
      }
      std::operator+(&local_f8,&local_38,pcVar2);
      std::__cxx11::to_string(&local_118,local_130.immediate);
      std::operator+(&local_d8,&local_f8,&local_118);
    }
    std::__cxx11::string::operator=((string *)instruction,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_118);
    this_00 = &local_f8;
  }
  else {
LAB_001026a6:
    if (local_130.srcType == '\0') {
      pcVar2 = " reg";
      if (local_130.isDstMem != false) {
        pcVar2 = " @reg";
      }
      std::operator+(&local_78,&local_38,pcVar2);
      std::__cxx11::to_string(&local_98,(uint)local_130.dstReg);
      std::operator+(&local_58,&local_78,&local_98);
      std::operator+(&local_118,&local_58,", ");
      pcVar2 = "reg";
      if (local_130.isSrcMem != false) {
        pcVar2 = " @reg";
      }
      std::operator+(&local_f8,&local_118,pcVar2);
      std::__cxx11::to_string(&local_b8,(uint)local_130.srcReg);
      std::operator+(&local_d8,&local_f8,&local_b8);
    }
    else {
      pcVar2 = " reg";
      if (local_130.isDstMem != false) {
        pcVar2 = " @reg";
      }
      std::operator+(&local_78,&local_38,pcVar2);
      std::__cxx11::to_string(&local_98,(uint)local_130.dstReg);
      std::operator+(&local_58,&local_78,&local_98);
      std::operator+(&local_118,&local_58,", ");
      pcVar2 = "";
      if (local_130.isSrcMem != false) {
        pcVar2 = "@";
      }
      std::operator+(&local_f8,&local_118,pcVar2);
      std::__cxx11::to_string(&local_b8,local_130.immediate);
      std::operator+(&local_d8,&local_f8,&local_b8);
    }
    std::__cxx11::string::operator=((string *)instruction,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    this_00 = &local_78;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0010266e:
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool NanoDebugger::disassembleInstruction(std::string &instruction) {
	Instruction ins;
	if (!fetch(ins)) {
		return false;
	}
	std::string opcode = instructionStr[ins.opcode];
	if (ins.opcode == Opcodes::Halt || ins.opcode == Opcodes::Ret) {
		instruction = opcode;
		return true;
	}
	// Single param instructions
	if (ins.opcode == Opcodes::Jg || ins.opcode == Opcodes::Js || ins.opcode == Opcodes::Jnz || ins.opcode == Opcodes::Jz ||
		ins.opcode == Opcodes::Jmp || ins.opcode == Opcodes::Push || ins.opcode == Opcodes::Pop || ins.opcode == Opcodes::Call ||
		ins.opcode == Opcodes::Dec || ins.opcode == Opcodes::Inc || ins.opcode == Opcodes::Printc || ins.opcode == Opcodes::Printi ||
		ins.opcode == Opcodes::Prints) {
		if (ins.srcType == DataType::Reg) {
			instruction = opcode + ((ins.isSrcMem) ? " @reg" : " reg") + std::to_string(ins.srcReg);
		}
		else {
			instruction = opcode + ((ins.isSrcMem) ? " @" : " ") + std::to_string(ins.immediate);
		}
	}
	// two param instruction 
	else {
		if (ins.srcType == DataType::Reg) {
			instruction = opcode + ((ins.isDstMem) ? " @reg" : " reg") + std::to_string(ins.dstReg) + ", " +
				((ins.isSrcMem) ? " @reg" : "reg") + std::to_string(ins.srcReg);
		}
		else {
			instruction = opcode + ((ins.isDstMem) ? " @reg" : " reg") + std::to_string(ins.dstReg) + ", " +
				((ins.isSrcMem) ? "@" : "") + std::to_string(ins.immediate);
		}
	}
	return true;
}